

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *this,int dimension,
          unsigned_short *vertices,pair<int,_float> _data,int offset)

{
  long lVar1;
  runtime_error *this_00;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  while( true ) {
    bVar4 = dimension == 0;
    dimension = dimension + -1;
    if (bVar4) {
      *(pair<int,_float> *)(this + 4) = _data;
      return;
    }
    lVar1 = *(long *)(this + 0x10);
    if (lVar1 == 0) break;
    offset = offset + 1;
    lVar2 = *(long *)(lVar1 + 0x10);
    lVar1 = lVar1 + 8;
    lVar3 = lVar1;
    if (lVar2 != 0) {
      do {
        bVar4 = *(ushort *)(lVar2 + 0x20) < vertices[offset];
        if (!bVar4) {
          lVar3 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar2 != 0);
    }
    lVar2 = lVar1;
    if ((lVar3 != lVar1) && (lVar2 = lVar3, vertices[offset] < *(ushort *)(lVar3 + 0x20))) {
      lVar2 = lVar1;
    }
    if (lVar2 == lVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"A cell could not be found in the directed flag complex.");
      goto LAB_0012eb22;
    }
    this = (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)(lVar2 + 0x28);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"A cell could not be found in the directed flag complex.");
LAB_0012eb22:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_data(int dimension, const Cell vertices, ExtraData _data, int offset = 0) {
		if (dimension == 0) {
			data = _data;
			return;
		}

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		pair->second.set_data(dimension - 1, vertices, _data, offset);
	}